

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O2

RK_S32 mpi_enc_opt_v(void *ctx,char *next)

{
  char *pcVar1;
  MpiEncTestArgs *cmd;
  
  if (next != (char *)0x0) {
    pcVar1 = strchr(next,0x71);
    if (pcVar1 != (char *)0x0) {
      *(undefined4 *)((long)ctx + 0xe4) = 1;
    }
    pcVar1 = strchr(next,0x66);
    if (pcVar1 != (char *)0x0) {
      *(undefined4 *)((long)ctx + 0xe8) = 1;
    }
    return 1;
  }
  return 0;
}

Assistant:

RK_S32 mpi_enc_opt_v(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        if (strstr(next, "q"))
            cmd->quiet = 1;
        if (strstr(next, "f"))
            cmd->trace_fps = 1;

        return 1;
    }

    return 0;
}